

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeReorganizeDataLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  undefined8 uVar1;
  ReorganizeDataLayerParams_ReorganizationType RVar2;
  string *psVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar4;
  ReorganizeDataLayerParams *from;
  ShapeRange local_1e0;
  ShapeRange local_1c0;
  ShapeRange local_1a0;
  ShapeRange local_180;
  ShapeRange local_160;
  ShapeRange local_140;
  ShapeRange local_120;
  ShapeRange local_100;
  ShapeRange local_e0;
  ShapeRange local_c0;
  ShapeRange local_a0;
  ShapeRange local_80;
  uint64_t local_50;
  size_t blockSize;
  ReorganizeDataLayerParams reorg;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar3);
  reorg._24_8_ = this_01;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_01,psVar3);
  uVar1 = reorg._24_8_;
  pSVar4 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar1,pSVar4);
  uVar1 = reorg._24_8_;
  pSVar4 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)uVar1,pSVar4);
  pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)reorg._24_8_);
  ShapeConstraint::updateSequenceRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)reorg._24_8_);
  ShapeConstraint::updateBatchRange(this_00,pSVar4);
  from = Specification::NeuralNetworkLayer::reorganizedata(specLayer);
  Specification::ReorganizeDataLayerParams::ReorganizeDataLayerParams
            ((ReorganizeDataLayerParams *)&blockSize,from);
  local_50 = Specification::ReorganizeDataLayerParams::blocksize
                       ((ReorganizeDataLayerParams *)&blockSize);
  RVar2 = Specification::ReorganizeDataLayerParams::mode((ReorganizeDataLayerParams *)&blockSize);
  uVar1 = reorg._24_8_;
  if (RVar2 == ReorganizeDataLayerParams_ReorganizationType_SPACE_TO_DEPTH) {
    pSVar4 = ShapeConstraint::channelRange(this_00);
    ShapeRange::operator*(&local_80,pSVar4,local_50 * local_50);
    ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar1,&local_80);
    uVar1 = reorg._24_8_;
    pSVar4 = ShapeConstraint::heightRange(this_00);
    ShapeRange::operator/(&local_a0,pSVar4,local_50);
    ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar1,&local_a0);
    uVar1 = reorg._24_8_;
    pSVar4 = ShapeConstraint::widthRange(this_00);
    ShapeRange::operator/(&local_c0,pSVar4,local_50);
    ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar1,&local_c0);
    pSVar4 = ShapeConstraint::channelRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator/(&local_e0,pSVar4,local_50 * local_50);
    ShapeConstraint::updateChannelRange(this_00,&local_e0);
    pSVar4 = ShapeConstraint::heightRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator*(&local_100,pSVar4,local_50);
    ShapeConstraint::updateHeightRange(this_00,&local_100);
    pSVar4 = ShapeConstraint::widthRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator*(&local_120,pSVar4,local_50);
    ShapeConstraint::updateWidthRange(this_00,&local_120);
  }
  else {
    pSVar4 = ShapeConstraint::channelRange(this_00);
    ShapeRange::operator/(&local_140,pSVar4,local_50 * local_50);
    ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar1,&local_140);
    uVar1 = reorg._24_8_;
    pSVar4 = ShapeConstraint::heightRange(this_00);
    ShapeRange::operator*(&local_160,pSVar4,local_50);
    ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar1,&local_160);
    uVar1 = reorg._24_8_;
    pSVar4 = ShapeConstraint::widthRange(this_00);
    ShapeRange::operator*(&local_180,pSVar4,local_50);
    ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar1,&local_180);
    pSVar4 = ShapeConstraint::channelRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator*(&local_1a0,pSVar4,local_50 * local_50);
    ShapeConstraint::updateChannelRange(this_00,&local_1a0);
    pSVar4 = ShapeConstraint::heightRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator/(&local_1c0,pSVar4,local_50);
    ShapeConstraint::updateHeightRange(this_00,&local_1c0);
    pSVar4 = ShapeConstraint::widthRange((ShapeConstraint *)reorg._24_8_);
    ShapeRange::operator/(&local_1e0,pSVar4,local_50);
    ShapeConstraint::updateWidthRange(this_00,&local_1e0);
  }
  Specification::ReorganizeDataLayerParams::~ReorganizeDataLayerParams
            ((ReorganizeDataLayerParams *)&blockSize);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReorganizeDataLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reorganize Data layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reorganize Data layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::ReorganizeDataLayerParams reorg = specLayer.reorganizedata();
    size_t blockSize = (size_t)reorg.blocksize();

    if (reorg.mode() == Specification::ReorganizeDataLayerParams::SPACE_TO_DEPTH){
        outputShape.updateChannelRange(inputShape.channelRange() * (blockSize * blockSize));
        outputShape.updateHeightRange(inputShape.heightRange() / blockSize);
        outputShape.updateWidthRange(inputShape.widthRange() / blockSize);
        inputShape.updateChannelRange(outputShape.channelRange() / (blockSize * blockSize));
        inputShape.updateHeightRange(outputShape.heightRange() * blockSize);
        inputShape.updateWidthRange(outputShape.widthRange() * blockSize);
    } else {
        outputShape.updateChannelRange(inputShape.channelRange() / (blockSize * blockSize));
        outputShape.updateHeightRange(inputShape.heightRange() * blockSize);
        outputShape.updateWidthRange(inputShape.widthRange() * blockSize);
        inputShape.updateChannelRange(outputShape.channelRange() * (blockSize * blockSize));
        inputShape.updateHeightRange(outputShape.heightRange() / blockSize);
        inputShape.updateWidthRange(outputShape.widthRange() / blockSize);
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reorganize Data layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reorganize Data layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}